

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O1

void __thiscall hwnet::util::TimerMgr::Schedule(TimerMgr *this,milliseconds *now)

{
  mutex *__mutex;
  __weak_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  ulong uVar3;
  ulong uVar4;
  _Manager_type p_Var5;
  undefined1 auVar6 [8];
  int iVar7;
  TimerMgr *pTVar8;
  pthread_t pVar9;
  bool bVar10;
  undefined1 local_40 [8];
  Ptr tmp;
  
  __mutex = &this->mtx;
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar7 != 0) {
    std::__throw_system_error(iVar7);
  }
  do {
    if (this->elements_size == 0) break;
    pTVar8 = this;
    if (this->elements_size != 0) {
      pTVar8 = (TimerMgr *)
               &(*(this->elements).
                  super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
                  _M_impl.super__Vector_impl_data._M_start)->selfPtr;
    }
    peVar2 = (pTVar8->empty_element_ptr).
             super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    tmp.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (pTVar8->empty_element_ptr).
         super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (tmp.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &((tmp.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<hwnet::util::Timer>)._M_weak_this.
                  super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
        UNLOCK();
      }
      else {
        p_Var1 = &((tmp.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<hwnet::util::Timer>)._M_weak_this.
                  super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      }
    }
    uVar3 = peVar2->mExpiredTime;
    uVar4 = *now;
    local_40 = (undefined1  [8])peVar2;
    if (uVar3 <= uVar4) {
      pVar9 = pthread_self();
      (peVar2->tid)._M_thread = pVar9;
      LOCK();
      bVar10 = (peVar2->mStatus).super___atomic_base<unsigned_int>._M_i == 0;
      if (bVar10) {
        (peVar2->mStatus).super___atomic_base<unsigned_int>._M_i = 4;
      }
      UNLOCK();
      pop(this);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      if (bVar10) {
        Timer::operator()((Timer *)local_40);
      }
      iVar7 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
      auVar6 = local_40;
      if (iVar7 != 0) {
        std::__throw_system_error(iVar7);
      }
      if ((bVar10) && (*(bool *)((long)local_40 + 0x40) == false)) {
        LOCK();
        bVar10 = (((atomic_uint *)((long)local_40 + 0x58))->super___atomic_base<unsigned_int>)._M_i
                 == 4;
        if (bVar10) {
          (((atomic_uint *)((long)local_40 + 0x58))->super___atomic_base<unsigned_int>)._M_i = 0;
        }
        UNLOCK();
        if (bVar10) {
          if (this->policy == 1) {
            *(milliseconds *)((long)local_40 + 0x30) =
                 *(milliseconds *)((long)local_40 + 0x38) + *now;
          }
          else {
            *(milliseconds *)((long)local_40 + 0x30) =
                 *(milliseconds *)((long)local_40 + 0x30) + *(milliseconds *)((long)local_40 + 0x38)
            ;
          }
          insert(this,(Ptr *)local_40);
          ((id *)((long)local_40 + 0x60))->_M_thread = 0;
          goto LAB_0011aff0;
        }
      }
      p_Var5 = (((Callback *)((long)local_40 + 0x10))->super__Function_base)._M_manager;
      if (p_Var5 != (_Manager_type)0x0) {
        (*p_Var5)((_Any_data *)((long)local_40 + 0x10),(_Any_data *)((long)local_40 + 0x10),
                  __destroy_functor);
        (((Callback *)((long)auVar6 + 0x10))->super__Function_base)._M_manager = (_Manager_type)0x0;
        ((Callback *)((long)auVar6 + 0x10))->_M_invoker = (_Invoker_type)0x0;
      }
    }
LAB_0011aff0:
    if (tmp.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 tmp.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  } while (uVar3 <= uVar4);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void TimerMgr::Schedule(const milliseconds &now) {
	this->mtx.lock();
    while (this->elements_size > 0) {
        auto tmp = top();
        if (tmp->mExpiredTime > now){
            break;
        }

       	tmp->tid = std::this_thread::get_id(); 
		uint expected = 0;
		uint setv = Timer::incallback;
		auto ok = tmp->mStatus.compare_exchange_strong(expected,setv);
        pop();

        this->mtx.unlock();
		
		if(ok) {
			(*tmp)();
		}

        this->mtx.lock();

        if(ok && !tmp->mOnce) {
        	expected = Timer::incallback;
        	setv = 0;
        	if(tmp->mStatus.compare_exchange_strong(expected,setv)) {
				if(this->policy == TimerMgr::normal) {
					tmp->mExpiredTime = now + tmp->mTimeout;
				} else {
	        		tmp->mExpiredTime += tmp->mTimeout;
	        	}
	        	this->insert(tmp);
	        	tmp->tid = std::thread::id();       
	        	continue; 		
        	}
        }
        tmp->mCallback = nullptr;
    }
    this->mtx.unlock();
}